

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::str_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          str_writer<char> *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t __tmp;
  size_t sVar7;
  long lVar8;
  int *piVar9;
  size_t size_1;
  size_t sVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  buffer<wchar_t> *c;
  ulong uVar15;
  size_t size;
  ulong uVar16;
  size_t sVar17;
  int iVar23;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  uVar12 = (ulong)(uint)specs->width;
  sVar17 = f->size_;
  sVar10 = sVar17;
  if (uVar12 != 0) {
    if (sVar17 == 0) {
      sVar10 = 0;
    }
    else {
      sVar10 = 0;
      sVar7 = 0;
      do {
        sVar10 = sVar10 + 1;
        sVar7 = sVar7 + 1;
      } while (sVar17 != sVar7);
    }
  }
  puVar2 = *(undefined8 **)this;
  lVar13 = puVar2[2];
  uVar15 = uVar12 - sVar10;
  if (uVar12 < sVar10 || uVar15 == 0) {
    uVar12 = lVar13 + sVar17;
    if ((ulong)puVar2[3] < uVar12) {
      (**(code **)*puVar2)(puVar2,uVar12);
      sVar17 = f->size_;
    }
    puVar2[2] = uVar12;
    if (0 < (long)sVar17) {
      lVar3 = puVar2[1];
      pcVar14 = f->s;
      uVar12 = sVar17 + 1;
      lVar8 = 0;
      do {
        *(int *)(lVar13 * 4 + lVar3 + lVar8 * 4) = (int)pcVar14[lVar8];
        uVar12 = uVar12 - 1;
        lVar8 = lVar8 + 1;
      } while (1 < uVar12);
    }
  }
  else {
    uVar16 = ((sVar17 + uVar12) - sVar10) + lVar13;
    if ((ulong)puVar2[3] < uVar16) {
      (**(code **)*puVar2)(puVar2,uVar16);
    }
    puVar2[2] = uVar16;
    auVar6 = _DAT_01db3e50;
    auVar5 = _DAT_01d84390;
    auVar4 = _DAT_01d84380;
    lVar3 = puVar2[1];
    piVar9 = (int *)(lVar3 + lVar13 * 4);
    wVar1 = (specs->fill).data_[0];
    bVar11 = specs->field_0x9 & 0xf;
    if (bVar11 == 3) {
      uVar16 = uVar15 >> 1;
      if (1 < uVar15) {
        piVar9 = piVar9 + uVar16;
        uVar15 = uVar16 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar28._8_4_ = (int)uVar15;
        auVar28._0_8_ = uVar15;
        auVar28._12_4_ = (int)(uVar15 >> 0x20);
        lVar3 = lVar3 + lVar13 * 4;
        lVar13 = 0;
        auVar28 = auVar28 ^ _DAT_01d84390;
        do {
          auVar25._8_4_ = (int)lVar13;
          auVar25._0_8_ = lVar13;
          auVar25._12_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar29 = (auVar25 | auVar4) ^ auVar5;
          iVar23 = auVar28._4_4_;
          if ((bool)(~(auVar29._4_4_ == iVar23 && auVar28._0_4_ < auVar29._0_4_ ||
                      iVar23 < auVar29._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar13 * 4) = wVar1;
          }
          if ((auVar29._12_4_ != auVar28._12_4_ || auVar29._8_4_ <= auVar28._8_4_) &&
              auVar29._12_4_ <= auVar28._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar13 * 4) = wVar1;
          }
          auVar25 = (auVar25 | auVar6) ^ auVar5;
          iVar30 = auVar25._4_4_;
          if (iVar30 <= iVar23 && (iVar30 != iVar23 || auVar25._0_4_ <= auVar28._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar13 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar13 * 4) = wVar1;
          }
          lVar13 = lVar13 + 4;
        } while ((uVar15 - ((uint)(uVar16 + 0x3fffffffffffffff) & 3)) + 4 != lVar13);
      }
      if (0 < (long)f->size_) {
        pcVar14 = f->s;
        uVar15 = f->size_ + 1;
        do {
          *piVar9 = (int)*pcVar14;
          pcVar14 = pcVar14 + 1;
          piVar9 = piVar9 + 1;
          uVar15 = uVar15 - 1;
        } while (1 < uVar15);
      }
      auVar6 = _DAT_01db3e50;
      auVar5 = _DAT_01d84390;
      auVar4 = _DAT_01d84380;
      uVar15 = (uVar12 * 4 + (sVar10 + uVar16) * -4) - 4;
      auVar29._8_4_ = (int)uVar15;
      auVar29._0_8_ = uVar15;
      auVar29._12_4_ = (int)(uVar15 >> 0x20);
      auVar20._0_8_ = uVar15 >> 2;
      auVar20._8_8_ = auVar29._8_8_ >> 2;
      uVar12 = 0;
      auVar20 = auVar20 ^ _DAT_01d84390;
      do {
        auVar26._8_4_ = (int)uVar12;
        auVar26._0_8_ = uVar12;
        auVar26._12_4_ = (int)(uVar12 >> 0x20);
        auVar28 = (auVar26 | auVar4) ^ auVar5;
        iVar23 = auVar20._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar23 && auVar20._0_4_ < auVar28._0_4_ ||
                    iVar23 < auVar28._4_4_) & 1)) {
          piVar9[uVar12] = wVar1;
        }
        if ((auVar28._12_4_ != auVar20._12_4_ || auVar28._8_4_ <= auVar20._8_4_) &&
            auVar28._12_4_ <= auVar20._12_4_) {
          piVar9[uVar12 + 1] = wVar1;
        }
        auVar28 = (auVar26 | auVar6) ^ auVar5;
        iVar30 = auVar28._4_4_;
        if (iVar30 <= iVar23 && (iVar30 != iVar23 || auVar28._0_4_ <= auVar20._0_4_)) {
          piVar9[uVar12 + 2] = wVar1;
          piVar9[uVar12 + 3] = wVar1;
        }
        uVar12 = uVar12 + 4;
      } while (((uVar15 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
    }
    else if (bVar11 == 2) {
      uVar16 = (uVar12 * 4 + sVar10 * -4) - 4;
      auVar18._8_4_ = (int)uVar16;
      auVar18._0_8_ = uVar16;
      auVar18._12_4_ = (int)(uVar16 >> 0x20);
      auVar19._0_8_ = uVar16 >> 2;
      auVar19._8_8_ = auVar18._8_8_ >> 2;
      lVar3 = lVar3 + lVar13 * 4;
      uVar12 = 0;
      auVar19 = auVar19 ^ _DAT_01d84390;
      do {
        auVar24._8_4_ = (int)uVar12;
        auVar24._0_8_ = uVar12;
        auVar24._12_4_ = (int)(uVar12 >> 0x20);
        auVar28 = (auVar24 | auVar4) ^ auVar5;
        iVar23 = auVar19._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar23 && auVar19._0_4_ < auVar28._0_4_ ||
                    iVar23 < auVar28._4_4_) & 1)) {
          *(wchar_t *)(lVar3 + uVar12 * 4) = wVar1;
        }
        if ((auVar28._12_4_ != auVar19._12_4_ || auVar28._8_4_ <= auVar19._8_4_) &&
            auVar28._12_4_ <= auVar19._12_4_) {
          *(wchar_t *)(lVar3 + 4 + uVar12 * 4) = wVar1;
        }
        auVar28 = (auVar24 | auVar6) ^ auVar5;
        iVar30 = auVar28._4_4_;
        if (iVar30 <= iVar23 && (iVar30 != iVar23 || auVar28._0_4_ <= auVar19._0_4_)) {
          *(wchar_t *)(lVar3 + 8 + uVar12 * 4) = wVar1;
          *(wchar_t *)(lVar3 + 0xc + uVar12 * 4) = wVar1;
        }
        uVar12 = uVar12 + 4;
      } while (((uVar16 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
      if (0 < (long)f->size_) {
        pcVar14 = f->s;
        uVar12 = f->size_ + 1;
        lVar13 = 0;
        do {
          piVar9[uVar15 + lVar13] = (int)pcVar14[lVar13];
          uVar12 = uVar12 - 1;
          lVar13 = lVar13 + 1;
        } while (1 < uVar12);
      }
    }
    else {
      if (0 < (long)f->size_) {
        pcVar14 = f->s;
        uVar15 = f->size_ + 1;
        do {
          *piVar9 = (int)*pcVar14;
          pcVar14 = pcVar14 + 1;
          piVar9 = piVar9 + 1;
          uVar15 = uVar15 - 1;
        } while (1 < uVar15);
      }
      auVar6 = _DAT_01db3e50;
      auVar5 = _DAT_01d84390;
      auVar4 = _DAT_01d84380;
      uVar15 = (uVar12 * 4 + sVar10 * -4) - 4;
      auVar21._8_4_ = (int)uVar15;
      auVar21._0_8_ = uVar15;
      auVar21._12_4_ = (int)(uVar15 >> 0x20);
      auVar22._0_8_ = uVar15 >> 2;
      auVar22._8_8_ = auVar21._8_8_ >> 2;
      uVar12 = 0;
      auVar22 = auVar22 ^ _DAT_01d84390;
      do {
        auVar27._8_4_ = (int)uVar12;
        auVar27._0_8_ = uVar12;
        auVar27._12_4_ = (int)(uVar12 >> 0x20);
        auVar28 = (auVar27 | auVar4) ^ auVar5;
        iVar23 = auVar22._4_4_;
        if ((bool)(~(auVar28._4_4_ == iVar23 && auVar22._0_4_ < auVar28._0_4_ ||
                    iVar23 < auVar28._4_4_) & 1)) {
          piVar9[uVar12] = wVar1;
        }
        if ((auVar28._12_4_ != auVar22._12_4_ || auVar28._8_4_ <= auVar22._8_4_) &&
            auVar28._12_4_ <= auVar22._12_4_) {
          piVar9[uVar12 + 1] = wVar1;
        }
        auVar28 = (auVar27 | auVar6) ^ auVar5;
        iVar30 = auVar28._4_4_;
        if (iVar30 <= iVar23 && (iVar30 != iVar23 || auVar28._0_4_ <= auVar22._0_4_)) {
          piVar9[uVar12 + 2] = wVar1;
          piVar9[uVar12 + 3] = wVar1;
        }
        uVar12 = uVar12 + 4;
      } while (((uVar15 >> 2) + 4 & 0xfffffffffffffffc) != uVar12);
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }